

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O3

void ncnn::conv3x3s1_winograd43(Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int nT,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar5;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int iVar10;
  undefined4 uVar11;
  void *pvVar12;
  void *pvVar13;
  size_t sVar14;
  size_t sVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  Mat *pMVar29;
  uint uVar30;
  uint max_jj;
  uint uVar31;
  uint uVar32;
  Mat *top_blob_00;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  uint max_ii;
  int iVar47;
  long lVar48;
  ulong uVar49;
  int iVar50;
  long lVar51;
  undefined1 (*pauVar52) [64];
  uint uVar53;
  int iVar54;
  int iVar55;
  undefined1 (*pauVar56) [64];
  undefined8 *puVar57;
  undefined8 *puVar58;
  int *piVar59;
  float *pfVar60;
  float *pfVar61;
  undefined1 (*pauVar62) [32];
  int iVar63;
  int m_2;
  int iVar64;
  int iVar65;
  uint uVar66;
  float *pfVar67;
  int m_4;
  int K;
  int iVar68;
  int iVar69;
  uint uVar70;
  long lVar71;
  int iVar72;
  long lVar73;
  undefined1 (*pauVar74) [64];
  undefined1 (*pauVar75) [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  uint N;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar113;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Mat m;
  float tmp [4] [6] [16];
  Allocator *_allocator;
  int local_81c;
  ulong local_818;
  ulong local_810;
  ulong local_808;
  long local_800;
  ulong local_7f8;
  ulong local_7f0;
  uint local_7e4;
  uint local_7e0;
  int local_7dc;
  int local_7d8;
  uint local_7d4;
  Mat local_7d0;
  Mat local_780;
  long local_738;
  ulong local_730;
  ulong local_728;
  Mat local_720;
  ulong local_6d8;
  ulong local_6d0;
  Mat *local_6c8;
  Mat *local_6c0;
  void *local_6b8;
  ulong local_6b0;
  ulong local_6a8;
  long local_6a0;
  long local_698;
  long local_690;
  ulong local_688;
  Mat local_680;
  float afStack_638 [6];
  undefined8 auStack_620 [6];
  undefined8 auStack_5f0 [2];
  float afStack_5e0 [8];
  undefined8 local_5c0 [12];
  undefined1 auStack_560 [32];
  undefined1 local_540 [64];
  undefined1 auStack_500 [192];
  undefined1 auStack_440 [192];
  undefined1 auStack_380 [384];
  undefined1 auStack_200 [384];
  undefined1 auStack_80 [80];
  undefined1 auVar112 [32];
  
  uVar1 = top_blob->w;
  uVar5 = top_blob->h;
  auVar97._4_4_ = uVar5;
  auVar97._0_4_ = uVar1;
  auVar76._8_4_ = 3;
  auVar76._0_8_ = 0x300000003;
  auVar76._12_4_ = 3;
  auVar97._8_8_ = 0;
  auVar76 = vpaddd_avx512vl(auVar97,auVar76);
  auVar97 = vpsrad_avx(auVar76,0x1f);
  auVar97 = vpsrld_avx(auVar97,0x1e);
  auVar76 = vpaddd_avx(auVar76,auVar97);
  auVar97 = vpsrad_avx(auVar76,2);
  auVar76 = vpshufd_avx(auVar97,0x55);
  auVar76 = vpmulld_avx(auVar76,auVar97);
  uVar70 = top_blob->elempack * top_blob->c;
  N = auVar76._0_4_;
  K = bottom_blob->elempack * bottom_blob->c;
  local_6c8 = AT;
  local_6c0 = bias;
  get_optimal_tile_mnk(uVar70,N,K,(int *)&local_7d4,&local_7d8,&local_81c,nT);
  iVar72 = local_7d8;
  iVar10 = local_81c;
  uVar30 = (int)(uVar70 + local_7d4 + -1) / (int)local_7d4;
  iVar50 = (int)(N + local_7d8 + -1) / local_7d8;
  iVar68 = (local_81c + K + -1) / local_81c;
  iVar64 = local_81c * local_7d8;
  _allocator = opt->workspace_allocator;
  local_780.cstep = 0;
  local_780.data = (void *)0x0;
  local_780.refcount._0_4_ = 0;
  local_780.refcount._4_4_ = 0;
  local_780.elemsize = 0;
  local_780.elempack = 0;
  local_780.allocator = (Allocator *)0x0;
  local_780.dims = 0;
  local_780.w = 0;
  local_780.h = 0;
  local_780.d = 0;
  local_780.c = 0;
  local_6d8 = (ulong)uVar70;
  Mat::create(&local_780,iVar64,0x24,iVar68,iVar50,4,_allocator);
  iVar50 = iVar68 * iVar50;
  iVar64 = iVar64 * 0x24;
  if ((nT < 2) || (nT <= iVar50)) {
    local_680.cstep = 0;
    local_680.data = (void *)0x0;
    local_680.refcount._0_4_ = 0;
    local_680.refcount._4_4_ = 0;
    local_680.elemsize = 0;
    local_680.elempack = 0;
    local_680.allocator = (Allocator *)0x0;
    local_680.dims = 0;
    local_680.w = 0;
    local_680.h = 0;
    local_680.d = 0;
    local_680.c = 0;
    Mat::create(&local_680,iVar64,1,nT,4,opt->workspace_allocator);
    if (0 < iVar50) {
      iVar64 = 0;
      do {
        iVar63 = iVar72 * (iVar64 / iVar68);
        iVar47 = iVar10 * (iVar64 % iVar68);
        iVar69 = N - iVar63;
        if (iVar72 < iVar69) {
          iVar69 = iVar72;
        }
        iVar65 = K - iVar47;
        if (iVar10 < iVar65) {
          iVar65 = iVar10;
        }
        iVar54 = get_omp_thread_num();
        local_7d0.data =
             (void *)((long)iVar54 * local_680.cstep * local_680.elemsize + (long)local_680.data);
        local_7d0.refcount._0_4_ = 0;
        local_7d0.refcount._4_4_ = 0;
        local_7d0.elemsize = local_680.elemsize;
        local_7d0.elempack = local_680.elempack;
        local_7d0.allocator = local_680.allocator;
        local_7d0.w = local_680.w;
        local_7d0.h = local_680.h;
        local_7d0.d = 1;
        local_7d0.c = local_680.d;
        local_7d0.dims = local_680.dims + -1;
        local_7d0.cstep =
             (local_680.elemsize * (long)local_680.h * (long)local_680.w + 0xf & 0xfffffffffffffff0)
             / local_680.elemsize;
        if (local_680.dims == 4) {
          local_7d0.cstep = (long)local_680.h * (long)local_680.w;
        }
        conv3x3s1_winograd43_transform_input_tile
                  (bottom_blob,&local_7d0,iVar63,iVar69,iVar47,iVar65,(int)_allocator);
        local_720.cstep = (long)local_780.h * (long)local_780.w;
        local_720.data =
             (void *)((long)local_780.data +
                     (uint)(iVar64 % iVar68) * local_780.elemsize * local_720.cstep +
                     (long)(iVar64 / iVar68) * local_780.cstep * local_780.elemsize);
        local_720.refcount = (int *)0x0;
        local_720.elemsize = local_780.elemsize;
        local_720.elempack = local_780.elempack;
        local_720.allocator = local_780.allocator;
        local_720.dims = 2;
        local_720.w = local_780.w;
        local_720.h = local_780.h;
        local_720.d = 1;
        local_720.c = 1;
        transpose_pack_B_tile(&local_7d0,&local_720,0x24,iVar69,iVar65,(int)local_720.cstep);
        iVar64 = iVar64 + 1;
      } while (iVar50 != iVar64);
    }
    piVar59 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
    if (piVar59 == (int *)0x0) goto LAB_001d74f6;
    LOCK();
    *piVar59 = *piVar59 + -1;
    UNLOCK();
    if (*piVar59 != 0) goto LAB_001d74f6;
    if (local_680.allocator != (Allocator *)0x0) {
      (*(local_680.allocator)->_vptr_Allocator[3])();
      goto LAB_001d74f6;
    }
  }
  else {
    local_680.cstep = 0;
    local_680.data = (void *)0x0;
    local_680.refcount._0_4_ = 0;
    local_680.refcount._4_4_ = 0;
    local_680.elemsize = 0;
    local_680.elempack = 0;
    local_680.allocator = (Allocator *)0x0;
    local_680.dims = 0;
    local_680.w = 0;
    local_680.h = 0;
    local_680.d = 0;
    local_680.c = 0;
    Mat::create(&local_680,iVar64,4,opt->workspace_allocator);
    if (0 < iVar50) {
      iVar64 = 0;
      do {
        iVar47 = iVar72 * (iVar64 / iVar68);
        iVar63 = iVar10 * (int)((long)iVar64 % (long)iVar68);
        iVar69 = N - iVar47;
        if (iVar72 < iVar69) {
          iVar69 = iVar72;
        }
        iVar65 = K - iVar63;
        if (iVar10 < iVar65) {
          iVar65 = iVar10;
        }
        conv3x3s1_winograd43_transform_input_tile
                  (bottom_blob,&local_680,iVar47,iVar69,iVar63,iVar65,(int)_allocator);
        local_7d0.cstep = (long)local_780.h * (long)local_780.w;
        local_7d0.data =
             (void *)((long)local_780.data +
                     ((long)iVar64 % (long)iVar68 & 0xffffffffU) * local_780.elemsize *
                     local_7d0.cstep +
                     (long)(iVar64 / iVar68) * local_780.cstep * local_780.elemsize);
        local_7d0.refcount._0_4_ = 0;
        local_7d0.refcount._4_4_ = 0;
        local_7d0.elemsize = local_780.elemsize;
        local_7d0.elempack = local_780.elempack;
        local_7d0.allocator = local_780.allocator;
        local_7d0.dims = 2;
        local_7d0.w = local_780.w;
        local_7d0.h = local_780.h;
        local_7d0.d = 1;
        local_7d0.c = 1;
        transpose_pack_B_tile(&local_680,&local_7d0,0x24,iVar69,iVar65,(int)local_7d0.cstep);
        iVar64 = iVar64 + 1;
      } while (iVar50 != iVar64);
    }
    piVar59 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
    if (piVar59 == (int *)0x0) goto LAB_001d74f6;
    LOCK();
    *piVar59 = *piVar59 + -1;
    UNLOCK();
    if (*piVar59 != 0) goto LAB_001d74f6;
    if (local_680.allocator != (Allocator *)0x0) {
      (*(local_680.allocator)->_vptr_Allocator[3])();
      goto LAB_001d74f6;
    }
  }
  if (local_680.data != (void *)0x0) {
    free(local_680.data);
  }
LAB_001d74f6:
  lVar71 = (long)local_7d8;
  local_7e4 = local_7d4;
  local_7d0.cstep = 0;
  local_7d0.data = (void *)0x0;
  local_7d0.refcount._0_4_ = 0;
  local_7d0.refcount._4_4_ = 0;
  local_7d0.elemsize = 0;
  local_7d0.elempack = 0;
  local_7d0.allocator = (Allocator *)0x0;
  local_7d0.dims = 0;
  local_7d0.w = 0;
  local_7d0.h = 0;
  local_7d0.d = 0;
  local_7d0.c = 0;
  Mat::create(&local_7d0,local_7d8 * local_7d4 * 0x24,1,nT,4,opt->workspace_allocator);
  if (0 < (int)uVar30) {
    uVar70 = 0;
    local_738 = lVar71;
    do {
      iVar64 = get_omp_thread_num();
      uVar53 = local_7e4 * uVar70;
      local_810 = (ulong)uVar53;
      max_ii = (int)local_6d8 - uVar53;
      if ((int)local_7e4 < (int)max_ii) {
        max_ii = local_7e4;
      }
      if (0 < (int)N) {
        top_blob_00 = (Mat *)((long)iVar64 * local_7d0.cstep * local_7d0.elemsize +
                             (long)local_7d0.data);
        lVar33 = (long)(int)uVar53;
        local_6b0 = (ulong)max_ii;
        local_800 = (long)(int)max_ii;
        local_808 = (ulong)uVar70;
        iVar64 = 0;
        uVar53 = N;
        do {
          local_7e0 = uVar53;
          pMVar29 = local_6c8;
          iVar10 = local_81c;
          uVar31 = (uint)lVar71;
          uVar53 = local_7e0;
          if ((int)uVar31 < (int)local_7e0) {
            uVar53 = uVar31;
          }
          local_698 = (long)(int)local_7e0;
          if (lVar71 < (int)local_7e0) {
            local_698 = lVar71;
          }
          max_jj = N - iVar64;
          if ((int)uVar31 < (int)(N - iVar64)) {
            max_jj = uVar31;
          }
          if (0 < K) {
            iVar50 = iVar64 / (int)local_738;
            iVar68 = 0;
            iVar72 = K;
            do {
              iVar69 = iVar72;
              if (iVar10 < iVar72) {
                iVar69 = iVar10;
              }
              local_680.w = pMVar29->w;
              local_680.h = pMVar29->h;
              local_680.elemsize = pMVar29->elemsize;
              local_680.elempack = pMVar29->elempack;
              local_680.allocator = pMVar29->allocator;
              local_680.cstep = (long)local_680.h * (long)local_680.w;
              local_680.data =
                   (void *)((long)pMVar29->data +
                           local_680.elemsize * local_680.cstep * (long)(iVar68 / iVar10) +
                           pMVar29->cstep * local_808 * local_680.elemsize);
              local_680.refcount._0_4_ = 0;
              local_680.refcount._4_4_ = 0;
              local_680.dims = 2;
              local_680.d = 1;
              local_680.c = 1;
              local_720.cstep = (long)local_780.h * (long)local_780.w;
              local_720.data =
                   (void *)((long)local_780.data +
                           local_780.elemsize * local_720.cstep * (long)(iVar68 / iVar10) +
                           local_780.cstep * (long)iVar50 * local_780.elemsize);
              local_720.refcount = (int *)0x0;
              local_720.elemsize = local_780.elemsize;
              local_720.elempack = local_780.elempack;
              local_720.allocator = local_780.allocator;
              local_720.dims = 2;
              local_720.w = local_780.w;
              local_720.h = local_780.h;
              local_720.d = 1;
              local_720.c = 1;
              iVar72 = -(iVar10 - iVar72);
              gemm_transB_packed_tile
                        (&local_680,&local_720,top_blob_00,0x24,max_ii,max_jj,iVar68,iVar69);
              iVar68 = iVar68 + iVar10;
            } while (iVar68 < K);
          }
          local_730 = (ulong)(uVar53 * 0x10);
          uVar66 = uVar53 * 0x20;
          lVar71 = (long)(int)(uVar53 * 0x10);
          iVar10 = top_blob->w;
          iVar72 = top_blob->elempack;
          iVar50 = top_blob->h;
          uVar31 = (int)top_blob->cstep * iVar72;
          local_818 = (ulong)uVar31;
          iVar68 = iVar10 + 6;
          if (-1 < iVar10 + 3) {
            iVar68 = iVar10 + 3;
          }
          iVar68 = iVar68 >> 2;
          uVar46 = 0;
          pvVar12 = local_6c0->data;
          iVar69 = (int)local_810;
          if (0xf < (int)max_ii) {
            local_7dc = uVar53 * 0x240;
            local_6a0 = (long)(int)uVar31;
            lVar51 = (long)(int)(uVar31 * 2);
            lVar34 = (long)(int)(uVar31 * 3);
            lVar35 = (long)(int)(uVar31 * 4);
            lVar36 = (long)(int)(uVar31 * 5);
            lVar37 = (long)(int)(uVar31 * 6);
            lVar73 = (long)(int)(uVar31 * 8);
            lVar38 = (long)(int)(uVar31 * 7);
            lVar39 = (long)(int)(uVar31 * 9);
            lVar40 = (long)(int)(uVar31 * 10);
            lVar41 = (long)(int)(uVar31 * 0xb);
            lVar42 = (long)(int)(uVar31 * 0xc);
            lVar43 = (long)(int)(uVar31 * 0xd);
            lVar44 = (long)(int)(uVar31 * 0xe);
            lVar45 = (long)(int)(uVar31 * 0xf);
            local_6b8 = (void *)((long)pvVar12 + lVar33 * 4);
            local_6a8 = (ulong)max_jj;
            local_7f8 = 0;
            uVar46 = 0;
            do {
              local_728 = uVar46;
              if (pvVar12 == (void *)0x0) {
                auVar84 = ZEXT1664((undefined1  [16])0x0);
              }
              else {
                auVar84 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)local_6b8 + local_728 * 4))
                ;
              }
              if (0 < (int)max_jj) {
                pauVar56 = (undefined1 (*) [64])
                           ((long)&top_blob_00->data + (long)(int)local_7f8 * 4);
                local_690 = (long)((iVar69 + (int)local_728) / iVar72);
                uVar46 = 0;
                do {
                  local_688 = uVar46;
                  iVar47 = iVar64 + (int)local_688;
                  lVar48 = -0x180;
                  auVar85 = vbroadcastss_avx512f(ZEXT416(0x3f3504f3));
                  auVar86 = vbroadcastss_avx512f(ZEXT416(0x3fb504f3));
                  auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
                  auVar88 = vbroadcastss_avx512f(ZEXT416(0x40000000));
                  auVar89 = vbroadcastss_avx512f(ZEXT416(0x3eb504f3));
                  auVar90 = vbroadcastss_avx512f(ZEXT416(0x403504f3));
                  pauVar52 = pauVar56;
                  do {
                    auVar91 = vaddps_avx512f(*(undefined1 (*) [64])
                                              (*pauVar52 + (long)(int)uVar66 * 4),
                                             *(undefined1 (*) [64])(*pauVar52 + lVar71 * 4));
                    auVar92 = vaddps_avx512f(*(undefined1 (*) [64])
                                              (*pauVar52 + (long)(int)(uVar53 * 0x40) * 4),
                                             *(undefined1 (*) [64])
                                              (*pauVar52 + (long)(int)(uVar53 * 0x30) * 4));
                    auVar93 = vsubps_avx512f(*(undefined1 (*) [64])(*pauVar52 + lVar71 * 4),
                                             *(undefined1 (*) [64])
                                              (*pauVar52 + (long)(int)uVar66 * 4));
                    auVar94 = vsubps_avx512f(*(undefined1 (*) [64])
                                              (*pauVar52 + (long)(int)(uVar53 * 0x30) * 4),
                                             *(undefined1 (*) [64])
                                              (*pauVar52 + (long)(int)(uVar53 * 0x40) * 4));
                    auVar95 = vaddps_avx512f(auVar91,*pauVar52);
                    auVar95 = vaddps_avx512f(auVar95,auVar92);
                    auVar96 = vmulps_avx512f(auVar93,auVar85);
                    auVar96 = vfmadd231ps_avx512f(auVar96,auVar94,auVar86);
                    auVar91 = vmulps_avx512f(auVar91,auVar87);
                    auVar93 = vfmadd213ps_avx512f(auVar93,auVar89,
                                                  *(undefined1 (*) [64])
                                                   (*pauVar52 + (long)(int)(uVar53 * 0x50) * 4));
                    auVar91 = vfmadd231ps_avx512f(auVar91,auVar92,auVar88);
                    auVar92 = vfmadd231ps_avx512f(auVar93,auVar94,auVar90);
                    *(undefined1 (*) [64])(auStack_500 + lVar48) = auVar95;
                    *(undefined1 (*) [64])(auStack_380 + lVar48) = auVar96;
                    *(undefined1 (*) [64])(auStack_200 + lVar48) = auVar91;
                    *(undefined1 (*) [64])(auStack_80 + lVar48) = auVar92;
                    pauVar52 = (undefined1 (*) [64])(*pauVar52 + (long)(int)(uVar53 * 0x60) * 4);
                    lVar48 = lVar48 + 0x40;
                  } while (lVar48 != 0);
                  iVar63 = iVar47 % iVar68;
                  uVar32 = iVar47 / iVar68 << 2;
                  pauVar52 = (undefined1 (*) [64])
                             ((long)top_blob->data +
                             (long)(iVar63 * 4 * iVar72) * 4 +
                             (long)top_blob->w * top_blob->elemsize * (long)(int)uVar32 +
                             top_blob->cstep * local_690 * top_blob->elemsize);
                  iVar65 = iVar63 * 4 + 1;
                  iVar54 = iVar63 * 4 + 2;
                  iVar47 = iVar63 * 4 + 3;
                  pauVar74 = &local_540;
                  lVar48 = 0;
                  do {
                    if ((int)(uVar32 | (uint)lVar48) < iVar50) {
                      auVar87 = vaddps_avx512f(pauVar74[-3],pauVar74[-4]);
                      auVar88 = vaddps_avx512f(pauVar74[-1],pauVar74[-2]);
                      auVar90 = vsubps_avx512f(pauVar74[-4],pauVar74[-3]);
                      auVar91 = vsubps_avx512f(pauVar74[-2],pauVar74[-1]);
                      auVar85 = vaddps_avx512f(auVar84,pauVar74[-5]);
                      auVar85 = vaddps_avx512f(auVar85,auVar87);
                      auVar92 = vaddps_avx512f(auVar85,auVar88);
                      auVar85._8_4_ = 0x3f3504f3;
                      auVar85._0_8_ = 0x3f3504f33f3504f3;
                      auVar85._12_4_ = 0x3f3504f3;
                      auVar85._16_4_ = 0x3f3504f3;
                      auVar85._20_4_ = 0x3f3504f3;
                      auVar85._24_4_ = 0x3f3504f3;
                      auVar85._28_4_ = 0x3f3504f3;
                      auVar85._32_4_ = 0x3f3504f3;
                      auVar85._36_4_ = 0x3f3504f3;
                      auVar85._40_4_ = 0x3f3504f3;
                      auVar85._44_4_ = 0x3f3504f3;
                      auVar85._48_4_ = 0x3f3504f3;
                      auVar85._52_4_ = 0x3f3504f3;
                      auVar85._56_4_ = 0x3f3504f3;
                      auVar85._60_4_ = 0x3f3504f3;
                      auVar85 = vfmadd231ps_avx512f(auVar84,auVar90,auVar85);
                      auVar86._8_4_ = 0x3f000000;
                      auVar86._0_8_ = 0x3f0000003f000000;
                      auVar86._12_4_ = 0x3f000000;
                      auVar86._16_4_ = 0x3f000000;
                      auVar86._20_4_ = 0x3f000000;
                      auVar86._24_4_ = 0x3f000000;
                      auVar86._28_4_ = 0x3f000000;
                      auVar86._32_4_ = 0x3f000000;
                      auVar86._36_4_ = 0x3f000000;
                      auVar86._40_4_ = 0x3f000000;
                      auVar86._44_4_ = 0x3f000000;
                      auVar86._48_4_ = 0x3f000000;
                      auVar86._52_4_ = 0x3f000000;
                      auVar86._56_4_ = 0x3f000000;
                      auVar86._60_4_ = 0x3f000000;
                      auVar86 = vfmadd132ps_avx512f(auVar87,auVar84,auVar86);
                      auVar87._8_4_ = 0x40000000;
                      auVar87._0_8_ = 0x4000000040000000;
                      auVar87._12_4_ = 0x40000000;
                      auVar87._16_4_ = 0x40000000;
                      auVar87._20_4_ = 0x40000000;
                      auVar87._24_4_ = 0x40000000;
                      auVar87._28_4_ = 0x40000000;
                      auVar87._32_4_ = 0x40000000;
                      auVar87._36_4_ = 0x40000000;
                      auVar87._40_4_ = 0x40000000;
                      auVar87._44_4_ = 0x40000000;
                      auVar87._48_4_ = 0x40000000;
                      auVar87._52_4_ = 0x40000000;
                      auVar87._56_4_ = 0x40000000;
                      auVar87._60_4_ = 0x40000000;
                      auVar86 = vfmadd231ps_avx512f(auVar86,auVar88,auVar87);
                      auVar87 = vaddps_avx512f(auVar84,*pauVar74);
                      auVar88._8_4_ = 0x3fb504f3;
                      auVar88._0_8_ = 0x3fb504f33fb504f3;
                      auVar88._12_4_ = 0x3fb504f3;
                      auVar88._16_4_ = 0x3fb504f3;
                      auVar88._20_4_ = 0x3fb504f3;
                      auVar88._24_4_ = 0x3fb504f3;
                      auVar88._28_4_ = 0x3fb504f3;
                      auVar88._32_4_ = 0x3fb504f3;
                      auVar88._36_4_ = 0x3fb504f3;
                      auVar88._40_4_ = 0x3fb504f3;
                      auVar88._44_4_ = 0x3fb504f3;
                      auVar88._48_4_ = 0x3fb504f3;
                      auVar88._52_4_ = 0x3fb504f3;
                      auVar88._56_4_ = 0x3fb504f3;
                      auVar88._60_4_ = 0x3fb504f3;
                      auVar85 = vfmadd231ps_avx512f(auVar85,auVar91,auVar88);
                      auVar89._8_4_ = 0x3eb504f3;
                      auVar89._0_8_ = 0x3eb504f33eb504f3;
                      auVar89._12_4_ = 0x3eb504f3;
                      auVar89._16_4_ = 0x3eb504f3;
                      auVar89._20_4_ = 0x3eb504f3;
                      auVar89._24_4_ = 0x3eb504f3;
                      auVar89._28_4_ = 0x3eb504f3;
                      auVar89._32_4_ = 0x3eb504f3;
                      auVar89._36_4_ = 0x3eb504f3;
                      auVar89._40_4_ = 0x3eb504f3;
                      auVar89._44_4_ = 0x3eb504f3;
                      auVar89._48_4_ = 0x3eb504f3;
                      auVar89._52_4_ = 0x3eb504f3;
                      auVar89._56_4_ = 0x3eb504f3;
                      auVar89._60_4_ = 0x3eb504f3;
                      auVar87 = vfmadd231ps_avx512f(auVar87,auVar90,auVar89);
                      auVar90._8_4_ = 0x403504f3;
                      auVar90._0_8_ = 0x403504f3403504f3;
                      auVar90._12_4_ = 0x403504f3;
                      auVar90._16_4_ = 0x403504f3;
                      auVar90._20_4_ = 0x403504f3;
                      auVar90._24_4_ = 0x403504f3;
                      auVar90._28_4_ = 0x403504f3;
                      auVar90._32_4_ = 0x403504f3;
                      auVar90._36_4_ = 0x403504f3;
                      auVar90._40_4_ = 0x403504f3;
                      auVar90._44_4_ = 0x403504f3;
                      auVar90._48_4_ = 0x403504f3;
                      auVar90._52_4_ = 0x403504f3;
                      auVar90._56_4_ = 0x403504f3;
                      auVar90._60_4_ = 0x403504f3;
                      auVar87 = vfmadd231ps_avx512f(auVar87,auVar91,auVar90);
                      if (iVar72 < 8) {
                        auVar76 = auVar87._0_16_;
                        auVar77 = auVar92._0_16_;
                        auVar78 = auVar85._0_16_;
                        auVar97 = auVar86._0_16_;
                        if (iVar72 == 1) {
                          *(int *)*pauVar52 = auVar92._0_4_;
                          uVar11 = vextractps_avx(auVar77,1);
                          *(undefined4 *)(*pauVar52 + local_6a0 * 4) = uVar11;
                          uVar11 = vextractps_avx(auVar77,2);
                          *(undefined4 *)(*pauVar52 + lVar51 * 4) = uVar11;
                          uVar11 = vextractps_avx(auVar77,3);
                          *(undefined4 *)(*pauVar52 + lVar34 * 4) = uVar11;
                          auVar77 = auVar92._16_16_;
                          *(int *)(*pauVar52 + lVar35 * 4) = auVar92._16_4_;
                          uVar11 = vextractps_avx(auVar77,1);
                          *(undefined4 *)(*pauVar52 + lVar36 * 4) = uVar11;
                          uVar11 = vextractps_avx(auVar77,2);
                          *(undefined4 *)(*pauVar52 + lVar37 * 4) = uVar11;
                          uVar11 = vextractps_avx(auVar77,3);
                          *(undefined4 *)(*pauVar52 + lVar38 * 4) = uVar11;
                          auVar77 = vextracti32x4_avx512f(auVar92,2);
                          *(int *)(*pauVar52 + lVar73 * 4) = auVar77._0_4_;
                          uVar11 = vextractps_avx(auVar77,1);
                          *(undefined4 *)(*pauVar52 + lVar39 * 4) = uVar11;
                          uVar11 = vextractps_avx(auVar77,2);
                          *(undefined4 *)(*pauVar52 + lVar40 * 4) = uVar11;
                          uVar11 = vextractps_avx(auVar77,3);
                          *(undefined4 *)(*pauVar52 + lVar41 * 4) = uVar11;
                          auVar77 = vextracti32x4_avx512f(auVar92,3);
                          *(int *)(*pauVar52 + lVar42 * 4) = auVar77._0_4_;
                          uVar11 = vextractps_avx(auVar77,1);
                          *(undefined4 *)(*pauVar52 + lVar43 * 4) = uVar11;
                          uVar11 = vextractps_avx(auVar77,2);
                          *(undefined4 *)(*pauVar52 + lVar44 * 4) = uVar11;
                          uVar11 = vextractps_avx(auVar77,3);
                          *(undefined4 *)(*pauVar52 + lVar45 * 4) = uVar11;
                          if (iVar65 < iVar10) {
                            *(int *)(*pauVar52 + 4) = auVar85._0_4_;
                            uVar11 = vextractps_avx(auVar78,1);
                            *(undefined4 *)(*pauVar52 + local_6a0 * 4 + 4) = uVar11;
                            uVar11 = vextractps_avx(auVar78,2);
                            *(undefined4 *)(*pauVar52 + lVar51 * 4 + 4) = uVar11;
                            uVar11 = vextractps_avx(auVar78,3);
                            *(undefined4 *)(*pauVar52 + lVar34 * 4 + 4) = uVar11;
                            auVar78 = auVar85._16_16_;
                            *(int *)(*pauVar52 + lVar35 * 4 + 4) = auVar85._16_4_;
                            uVar11 = vextractps_avx(auVar78,1);
                            *(undefined4 *)(*pauVar52 + lVar36 * 4 + 4) = uVar11;
                            uVar11 = vextractps_avx(auVar78,2);
                            *(undefined4 *)(*pauVar52 + lVar37 * 4 + 4) = uVar11;
                            uVar11 = vextractps_avx(auVar78,3);
                            *(undefined4 *)(*pauVar52 + lVar38 * 4 + 4) = uVar11;
                            auVar78 = vextracti32x4_avx512f(auVar85,2);
                            *(int *)(*pauVar52 + lVar73 * 4 + 4) = auVar78._0_4_;
                            uVar11 = vextractps_avx(auVar78,1);
                            *(undefined4 *)(*pauVar52 + lVar39 * 4 + 4) = uVar11;
                            uVar11 = vextractps_avx(auVar78,2);
                            *(undefined4 *)(*pauVar52 + lVar40 * 4 + 4) = uVar11;
                            uVar11 = vextractps_avx(auVar78,3);
                            *(undefined4 *)(*pauVar52 + lVar41 * 4 + 4) = uVar11;
                            auVar78 = vextracti32x4_avx512f(auVar85,3);
                            *(int *)(*pauVar52 + lVar42 * 4 + 4) = auVar78._0_4_;
                            uVar11 = vextractps_avx(auVar78,1);
                            *(undefined4 *)(*pauVar52 + lVar43 * 4 + 4) = uVar11;
                            uVar11 = vextractps_avx(auVar78,2);
                            *(undefined4 *)(*pauVar52 + lVar44 * 4 + 4) = uVar11;
                            uVar11 = vextractps_avx(auVar78,3);
                            *(undefined4 *)(*pauVar52 + lVar45 * 4 + 4) = uVar11;
                          }
                          if (iVar54 < iVar10) {
                            *(int *)(*pauVar52 + 8) = auVar86._0_4_;
                            uVar11 = vextractps_avx(auVar97,1);
                            *(undefined4 *)(*pauVar52 + local_6a0 * 4 + 8) = uVar11;
                            uVar11 = vextractps_avx(auVar97,2);
                            *(undefined4 *)(*pauVar52 + lVar51 * 4 + 8) = uVar11;
                            uVar11 = vextractps_avx(auVar97,3);
                            *(undefined4 *)(*pauVar52 + lVar34 * 4 + 8) = uVar11;
                            auVar97 = auVar86._16_16_;
                            *(int *)(*pauVar52 + lVar35 * 4 + 8) = auVar86._16_4_;
                            uVar11 = vextractps_avx(auVar97,1);
                            *(undefined4 *)(*pauVar52 + lVar36 * 4 + 8) = uVar11;
                            uVar11 = vextractps_avx(auVar97,2);
                            *(undefined4 *)(*pauVar52 + lVar37 * 4 + 8) = uVar11;
                            uVar11 = vextractps_avx(auVar97,3);
                            *(undefined4 *)(*pauVar52 + lVar38 * 4 + 8) = uVar11;
                            auVar97 = vextracti32x4_avx512f(auVar86,2);
                            *(int *)(*pauVar52 + lVar73 * 4 + 8) = auVar97._0_4_;
                            uVar11 = vextractps_avx(auVar97,1);
                            *(undefined4 *)(*pauVar52 + lVar39 * 4 + 8) = uVar11;
                            uVar11 = vextractps_avx(auVar97,2);
                            *(undefined4 *)(*pauVar52 + lVar40 * 4 + 8) = uVar11;
                            uVar11 = vextractps_avx(auVar97,3);
                            *(undefined4 *)(*pauVar52 + lVar41 * 4 + 8) = uVar11;
                            auVar97 = vextracti32x4_avx512f(auVar86,3);
                            *(int *)(*pauVar52 + lVar42 * 4 + 8) = auVar97._0_4_;
                            uVar11 = vextractps_avx(auVar97,1);
                            *(undefined4 *)(*pauVar52 + lVar43 * 4 + 8) = uVar11;
                            uVar11 = vextractps_avx(auVar97,2);
                            *(undefined4 *)(*pauVar52 + lVar44 * 4 + 8) = uVar11;
                            uVar11 = vextractps_avx(auVar97,3);
                            *(undefined4 *)(*pauVar52 + lVar45 * 4 + 8) = uVar11;
                          }
                          if (iVar47 < iVar10) {
                            *(int *)(*pauVar52 + 0xc) = auVar87._0_4_;
                            uVar11 = vextractps_avx(auVar76,1);
                            *(undefined4 *)(*pauVar52 + local_6a0 * 4 + 0xc) = uVar11;
                            uVar11 = vextractps_avx(auVar76,2);
                            *(undefined4 *)(*pauVar52 + lVar51 * 4 + 0xc) = uVar11;
                            uVar11 = vextractps_avx(auVar76,3);
                            *(undefined4 *)(*pauVar52 + lVar34 * 4 + 0xc) = uVar11;
                            auVar76 = auVar87._16_16_;
                            *(int *)(*pauVar52 + lVar35 * 4 + 0xc) = auVar87._16_4_;
                            uVar11 = vextractps_avx(auVar76,1);
                            *(undefined4 *)(*pauVar52 + lVar36 * 4 + 0xc) = uVar11;
                            uVar11 = vextractps_avx(auVar76,2);
                            *(undefined4 *)(*pauVar52 + lVar37 * 4 + 0xc) = uVar11;
                            uVar11 = vextractps_avx(auVar76,3);
                            *(undefined4 *)(*pauVar52 + lVar38 * 4 + 0xc) = uVar11;
                            auVar76 = vextracti32x4_avx512f(auVar87,2);
                            *(int *)(*pauVar52 + lVar73 * 4 + 0xc) = auVar76._0_4_;
                            uVar11 = vextractps_avx(auVar76,1);
                            *(undefined4 *)(*pauVar52 + lVar39 * 4 + 0xc) = uVar11;
                            uVar11 = vextractps_avx(auVar76,2);
                            *(undefined4 *)(*pauVar52 + lVar40 * 4 + 0xc) = uVar11;
                            uVar11 = vextractps_avx(auVar76,3);
                            *(undefined4 *)(*pauVar52 + lVar41 * 4 + 0xc) = uVar11;
                            auVar76 = vextracti32x4_avx512f(auVar87,3);
                            *(int *)(*pauVar52 + lVar42 * 4 + 0xc) = auVar76._0_4_;
                            uVar11 = vextractps_avx(auVar76,1);
                            *(undefined4 *)(*pauVar52 + lVar43 * 4 + 0xc) = uVar11;
                            uVar11 = vextractps_avx(auVar76,2);
                            *(undefined4 *)(*pauVar52 + lVar44 * 4 + 0xc) = uVar11;
                            uVar11 = vextractps_avx(auVar76,3);
                            *(undefined4 *)(*pauVar52 + lVar45 * 4 + 0xc) = uVar11;
                          }
                        }
                        else if (iVar72 == 4) {
                          *(undefined1 (*) [16])*pauVar52 = auVar77;
                          auVar77 = vextractf32x4_avx512f(auVar92,1);
                          *(undefined1 (*) [16])(*pauVar52 + local_6a0 * 4) = auVar77;
                          auVar77 = vextractf32x4_avx512f(auVar92,2);
                          *(undefined1 (*) [16])(*pauVar52 + lVar51 * 4) = auVar77;
                          auVar77 = vextractf32x4_avx512f(auVar92,3);
                          *(undefined1 (*) [16])(*pauVar52 + lVar34 * 4) = auVar77;
                          if (iVar65 < iVar10) {
                            *(undefined1 (*) [16])(*pauVar52 + 0x10) = auVar78;
                            auVar78 = vextractf32x4_avx512f(auVar85,1);
                            *(undefined1 (*) [16])(*pauVar52 + local_6a0 * 4 + 8) = auVar78;
                            auVar78 = vextractf32x4_avx512f(auVar85,2);
                            *(undefined1 (*) [16])(*pauVar52 + lVar51 * 4 + 8) = auVar78;
                            auVar78 = vextractf32x4_avx512f(auVar85,3);
                            *(undefined1 (*) [16])(*pauVar52 + lVar34 * 4 + 8) = auVar78;
                          }
                          if (iVar54 < iVar10) {
                            *(undefined1 (*) [16])(*pauVar52 + 0x20) = auVar97;
                            auVar97 = vextractf32x4_avx512f(auVar86,1);
                            *(undefined1 (*) [16])(*pauVar52 + local_6a0 * 4 + 0x10) = auVar97;
                            auVar97 = vextractf32x4_avx512f(auVar86,2);
                            *(undefined1 (*) [16])(*pauVar52 + lVar51 * 4 + 0x10) = auVar97;
                            auVar97 = vextractf32x4_avx512f(auVar86,3);
                            *(undefined1 (*) [16])(*pauVar52 + lVar34 * 4 + 0x10) = auVar97;
                          }
                          if (iVar47 < iVar10) {
                            *(undefined1 (*) [16])(*pauVar52 + 0x30) = auVar76;
                            auVar76 = vextractf32x4_avx512f(auVar87,1);
                            *(undefined1 (*) [16])(*pauVar52 + local_6a0 * 4 + 0x18) = auVar76;
                            auVar76 = vextractf32x4_avx512f(auVar87,2);
                            *(undefined1 (*) [16])(*pauVar52 + lVar51 * 4 + 0x18) = auVar76;
                            auVar76 = vextractf32x4_avx512f(auVar87,3);
                            *(undefined1 (*) [16])(*pauVar52 + lVar34 * 4 + 0x18) = auVar76;
                          }
                        }
                      }
                      else if (iVar72 == 8) {
                        *(undefined1 (*) [32])*pauVar52 = auVar92._0_32_;
                        auVar80 = vextractf64x4_avx512f(auVar92,1);
                        *(undefined1 (*) [32])(*pauVar52 + local_6a0 * 4) = auVar80;
                        if (iVar65 < iVar10) {
                          *(undefined1 (*) [32])(*pauVar52 + 0x20) = auVar85._0_32_;
                          auVar80 = vextractf64x4_avx512f(auVar85,1);
                          *(undefined1 (*) [32])(*pauVar52 + local_6a0 * 4 + 0x10) = auVar80;
                        }
                        if (iVar54 < iVar10) {
                          *(undefined1 (*) [32])pauVar52[1] = auVar86._0_32_;
                          auVar80 = vextractf64x4_avx512f(auVar86,1);
                          *(undefined1 (*) [32])(*pauVar52 + local_6a0 * 4 + 0x20) = auVar80;
                        }
                        if (iVar47 < iVar10) {
                          *(undefined1 (*) [32])(pauVar52[1] + 0x20) = auVar87._0_32_;
                          auVar80 = vextractf64x4_avx512f(auVar87,1);
                          *(undefined1 (*) [32])(*pauVar52 + local_6a0 * 4 + 0x30) = auVar80;
                        }
                      }
                      else if (iVar72 == 0x10) {
                        *pauVar52 = auVar92;
                        if (iVar65 < iVar10) {
                          pauVar52[1] = auVar85;
                        }
                        if (iVar54 < iVar10) {
                          pauVar52[2] = auVar86;
                        }
                        if (iVar47 < iVar10) {
                          pauVar52[3] = auVar87;
                        }
                      }
                      pauVar52 = (undefined1 (*) [64])(*pauVar52 + (long)(iVar72 * iVar10) * 4);
                    }
                    lVar48 = lVar48 + 1;
                    pauVar74 = pauVar74 + 6;
                  } while (lVar48 != 4);
                  pauVar56 = pauVar56 + 1;
                  uVar46 = local_688 + 1;
                } while (local_688 + 1 != local_6a8);
              }
              uVar46 = local_728 + 0x10;
              local_7f8 = (ulong)(uint)((int)local_7f8 + local_7dc);
              local_6d0 = (ulong)uVar66;
            } while (local_728 + 0x1f < local_6b0);
          }
          local_7f0 = (ulong)(uVar53 * 8);
          lVar34 = (long)(int)(uVar53 * 8);
          if ((int)((uint)uVar46 | 7) < (int)max_ii) {
            lVar35 = (long)(int)uVar31;
            lVar41 = (long)(int)(uVar31 * 2);
            lVar36 = (long)(int)(uVar31 * 3);
            lVar37 = (long)(int)(uVar31 * 4);
            lVar38 = (long)(int)(uVar31 * 5);
            lVar39 = (long)(int)(uVar31 * 6);
            lVar40 = (long)(int)(uVar31 * 7);
            iVar47 = (uint)uVar46 * uVar53 * 0x24;
            uVar49 = uVar46 & 0xffffffff;
            do {
              if (pvVar12 == (void *)0x0) {
                auVar80 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              }
              else {
                auVar80 = *(undefined1 (*) [32])((long)pvVar12 + uVar49 * 4 + lVar33 * 4);
              }
              if (0 < (int)max_jj) {
                pfVar60 = (float *)((long)&top_blob_00->data + (long)iVar47 * 4);
                uVar46 = 0;
                do {
                  iVar63 = (int)uVar46 + iVar64;
                  lVar42 = -0xc0;
                  auVar83._8_4_ = 0x3fb504f3;
                  auVar83._0_8_ = 0x3fb504f33fb504f3;
                  auVar83._12_4_ = 0x3fb504f3;
                  auVar83._16_4_ = 0x3fb504f3;
                  auVar83._20_4_ = 0x3fb504f3;
                  auVar83._24_4_ = 0x3fb504f3;
                  auVar83._28_4_ = 0x3fb504f3;
                  auVar130._8_4_ = 0x40000000;
                  auVar130._0_8_ = 0x4000000040000000;
                  auVar130._12_4_ = 0x40000000;
                  auVar130._16_4_ = 0x40000000;
                  auVar130._20_4_ = 0x40000000;
                  auVar130._24_4_ = 0x40000000;
                  auVar130._28_4_ = 0x40000000;
                  auVar81._8_4_ = 0x3eb504f3;
                  auVar81._0_8_ = 0x3eb504f33eb504f3;
                  auVar81._12_4_ = 0x3eb504f3;
                  auVar81._16_4_ = 0x3eb504f3;
                  auVar81._20_4_ = 0x3eb504f3;
                  auVar81._24_4_ = 0x3eb504f3;
                  auVar81._28_4_ = 0x3eb504f3;
                  auVar82._8_4_ = 0x403504f3;
                  auVar82._0_8_ = 0x403504f3403504f3;
                  auVar82._12_4_ = 0x403504f3;
                  auVar82._16_4_ = 0x403504f3;
                  auVar82._20_4_ = 0x403504f3;
                  auVar82._24_4_ = 0x403504f3;
                  auVar82._28_4_ = 0x403504f3;
                  pfVar61 = pfVar60;
                  do {
                    auVar6 = *(undefined1 (*) [32])(pfVar61 + lVar34);
                    auVar7 = *(undefined1 (*) [32])(pfVar61 + lVar71);
                    auVar8 = *(undefined1 (*) [32])(pfVar61 + (int)(uVar53 * 0x18));
                    auVar9 = *(undefined1 (*) [32])(pfVar61 + (int)uVar66);
                    fVar113 = auVar7._0_4_ + auVar6._0_4_;
                    fVar116 = auVar7._4_4_ + auVar6._4_4_;
                    fVar117 = auVar7._8_4_ + auVar6._8_4_;
                    fVar118 = auVar7._12_4_ + auVar6._12_4_;
                    fVar119 = auVar7._16_4_ + auVar6._16_4_;
                    fVar120 = auVar7._20_4_ + auVar6._20_4_;
                    fVar121 = auVar7._24_4_ + auVar6._24_4_;
                    fVar122 = auVar7._28_4_ + auVar6._28_4_;
                    auVar126._0_4_ = auVar9._0_4_ + auVar8._0_4_;
                    auVar126._4_4_ = auVar9._4_4_ + auVar8._4_4_;
                    auVar126._8_4_ = auVar9._8_4_ + auVar8._8_4_;
                    auVar126._12_4_ = auVar9._12_4_ + auVar8._12_4_;
                    auVar126._16_4_ = auVar9._16_4_ + auVar8._16_4_;
                    auVar126._20_4_ = auVar9._20_4_ + auVar8._20_4_;
                    auVar126._24_4_ = auVar9._24_4_ + auVar8._24_4_;
                    auVar126._28_4_ = auVar9._28_4_ + auVar8._28_4_;
                    auVar6 = vsubps_avx(auVar6,auVar7);
                    auVar7 = vsubps_avx(auVar8,auVar9);
                    auVar108._0_4_ = fVar113 + *pfVar61 + auVar126._0_4_;
                    auVar108._4_4_ = fVar116 + pfVar61[1] + auVar126._4_4_;
                    auVar108._8_4_ = fVar117 + pfVar61[2] + auVar126._8_4_;
                    auVar108._12_4_ = fVar118 + pfVar61[3] + auVar126._12_4_;
                    auVar108._16_4_ = fVar119 + pfVar61[4] + auVar126._16_4_;
                    auVar108._20_4_ = fVar120 + pfVar61[5] + auVar126._20_4_;
                    auVar108._24_4_ = fVar121 + pfVar61[6] + auVar126._24_4_;
                    auVar108._28_4_ = fVar122 + pfVar61[7] + auVar126._28_4_;
                    auVar8._4_4_ = auVar6._4_4_ * 0.70710677;
                    auVar8._0_4_ = auVar6._0_4_ * 0.70710677;
                    auVar8._8_4_ = auVar6._8_4_ * 0.70710677;
                    auVar8._12_4_ = auVar6._12_4_ * 0.70710677;
                    auVar8._16_4_ = auVar6._16_4_ * 0.70710677;
                    auVar8._20_4_ = auVar6._20_4_ * 0.70710677;
                    auVar8._24_4_ = auVar6._24_4_ * 0.70710677;
                    auVar8._28_4_ = auVar9._28_4_;
                    auVar97 = vfmadd231ps_fma(auVar8,auVar7,auVar83);
                    auVar9._4_4_ = fVar116 * 0.5;
                    auVar9._0_4_ = fVar113 * 0.5;
                    auVar9._8_4_ = fVar117 * 0.5;
                    auVar9._12_4_ = fVar118 * 0.5;
                    auVar9._16_4_ = fVar119 * 0.5;
                    auVar9._20_4_ = fVar120 * 0.5;
                    auVar9._24_4_ = fVar121 * 0.5;
                    auVar9._28_4_ = fVar122;
                    auVar76 = vfmadd213ps_fma(auVar6,auVar81,
                                              *(undefined1 (*) [32])(pfVar61 + (int)(uVar53 * 0x28))
                                             );
                    auVar78 = vfmadd231ps_fma(auVar9,auVar126,auVar130);
                    auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar7,auVar82);
                    *(undefined1 (*) [32])((long)local_5c0 + lVar42) = auVar108;
                    *(undefined1 (*) [32])(auStack_500 + lVar42) = ZEXT1632(auVar97);
                    *(undefined1 (*) [32])(auStack_440 + lVar42) = ZEXT1632(auVar78);
                    *(undefined1 (*) [32])(auStack_380 + lVar42) = ZEXT1632(auVar76);
                    pfVar61 = pfVar61 + (int)(uVar53 * 0x30);
                    lVar42 = lVar42 + 0x20;
                  } while (lVar42 != 0);
                  iVar65 = iVar63 % iVar68;
                  uVar32 = iVar63 / iVar68 << 2;
                  pauVar62 = (undefined1 (*) [32])
                             ((long)top_blob->data +
                             (long)(iVar65 * 4 * iVar72) * 4 +
                             (long)top_blob->w * top_blob->elemsize * (long)(int)uVar32 +
                             top_blob->cstep * (long)((iVar69 + (int)uVar49) / iVar72) *
                             top_blob->elemsize);
                  iVar54 = iVar65 * 4 + 1;
                  iVar55 = iVar65 * 4 + 2;
                  iVar63 = iVar65 * 4 + 3;
                  pfVar61 = afStack_5e0;
                  lVar42 = 0;
                  do {
                    if ((int)(uVar32 | (uint)lVar42) < iVar50) {
                      auVar83 = *(undefined1 (*) [32])(pfVar61 + -0x20);
                      auVar130 = *(undefined1 (*) [32])(pfVar61 + -0x18);
                      auVar81 = *(undefined1 (*) [32])(pfVar61 + -0x10);
                      auVar82 = *(undefined1 (*) [32])(pfVar61 + -8);
                      auVar102._0_4_ = auVar130._0_4_ + auVar83._0_4_;
                      auVar102._4_4_ = auVar130._4_4_ + auVar83._4_4_;
                      auVar102._8_4_ = auVar130._8_4_ + auVar83._8_4_;
                      auVar102._12_4_ = auVar130._12_4_ + auVar83._12_4_;
                      auVar102._16_4_ = auVar130._16_4_ + auVar83._16_4_;
                      auVar102._20_4_ = auVar130._20_4_ + auVar83._20_4_;
                      auVar102._24_4_ = auVar130._24_4_ + auVar83._24_4_;
                      auVar102._28_4_ = auVar130._28_4_ + auVar83._28_4_;
                      auVar127._0_4_ = auVar82._0_4_ + auVar81._0_4_;
                      auVar127._4_4_ = auVar82._4_4_ + auVar81._4_4_;
                      auVar127._8_4_ = auVar82._8_4_ + auVar81._8_4_;
                      auVar127._12_4_ = auVar82._12_4_ + auVar81._12_4_;
                      auVar127._16_4_ = auVar82._16_4_ + auVar81._16_4_;
                      auVar127._20_4_ = auVar82._20_4_ + auVar81._20_4_;
                      auVar127._24_4_ = auVar82._24_4_ + auVar81._24_4_;
                      auVar127._28_4_ = auVar82._28_4_ + auVar81._28_4_;
                      auVar83 = vsubps_avx(auVar83,auVar130);
                      auVar130 = vsubps_avx(auVar81,auVar82);
                      auVar109._0_4_ =
                           auVar80._0_4_ + pfVar61[-0x28] + auVar102._0_4_ + auVar127._0_4_;
                      auVar109._4_4_ =
                           auVar80._4_4_ + pfVar61[-0x27] + auVar102._4_4_ + auVar127._4_4_;
                      auVar109._8_4_ =
                           auVar80._8_4_ + pfVar61[-0x26] + auVar102._8_4_ + auVar127._8_4_;
                      auVar109._12_4_ =
                           auVar80._12_4_ + pfVar61[-0x25] + auVar102._12_4_ + auVar127._12_4_;
                      auVar112._16_4_ =
                           auVar80._16_4_ + pfVar61[-0x24] + auVar102._16_4_ + auVar127._16_4_;
                      auVar112._0_16_ = auVar109;
                      auVar112._20_4_ =
                           auVar80._20_4_ + pfVar61[-0x23] + auVar102._20_4_ + auVar127._20_4_;
                      auVar112._24_4_ =
                           auVar80._24_4_ + pfVar61[-0x22] + auVar102._24_4_ + auVar127._24_4_;
                      auVar112._28_4_ =
                           auVar80._28_4_ + pfVar61[-0x21] + auVar102._28_4_ + auVar127._28_4_;
                      auVar6._8_4_ = 0x3f3504f3;
                      auVar6._0_8_ = 0x3f3504f33f3504f3;
                      auVar6._12_4_ = 0x3f3504f3;
                      auVar6._16_4_ = 0x3f3504f3;
                      auVar6._20_4_ = 0x3f3504f3;
                      auVar6._24_4_ = 0x3f3504f3;
                      auVar6._28_4_ = 0x3f3504f3;
                      auVar81 = vfmadd231ps_avx512vl(auVar80,auVar83,auVar6);
                      auVar7._8_4_ = 0x3f000000;
                      auVar7._0_8_ = 0x3f0000003f000000;
                      auVar7._12_4_ = 0x3f000000;
                      auVar7._16_4_ = 0x3f000000;
                      auVar7._20_4_ = 0x3f000000;
                      auVar7._24_4_ = 0x3f000000;
                      auVar7._28_4_ = 0x3f000000;
                      auVar82 = vfmadd132ps_avx512vl(auVar102,auVar80,auVar7);
                      auVar25._8_4_ = 0x40000000;
                      auVar25._0_8_ = 0x4000000040000000;
                      auVar25._12_4_ = 0x40000000;
                      auVar25._16_4_ = 0x40000000;
                      auVar25._20_4_ = 0x40000000;
                      auVar25._24_4_ = 0x40000000;
                      auVar25._28_4_ = 0x40000000;
                      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar127,auVar25);
                      auVar99._0_4_ = auVar80._0_4_ + *pfVar61;
                      auVar99._4_4_ = auVar80._4_4_ + pfVar61[1];
                      auVar99._8_4_ = auVar80._8_4_ + pfVar61[2];
                      auVar99._12_4_ = auVar80._12_4_ + pfVar61[3];
                      auVar99._16_4_ = auVar80._16_4_ + pfVar61[4];
                      auVar99._20_4_ = auVar80._20_4_ + pfVar61[5];
                      auVar99._24_4_ = auVar80._24_4_ + pfVar61[6];
                      auVar99._28_4_ = auVar80._28_4_ + pfVar61[7];
                      auVar26._8_4_ = 0x3fb504f3;
                      auVar26._0_8_ = 0x3fb504f33fb504f3;
                      auVar26._12_4_ = 0x3fb504f3;
                      auVar26._16_4_ = 0x3fb504f3;
                      auVar26._20_4_ = 0x3fb504f3;
                      auVar26._24_4_ = 0x3fb504f3;
                      auVar26._28_4_ = 0x3fb504f3;
                      auVar81 = vfmadd231ps_avx512vl(auVar81,auVar130,auVar26);
                      auVar27._8_4_ = 0x3eb504f3;
                      auVar27._0_8_ = 0x3eb504f33eb504f3;
                      auVar27._12_4_ = 0x3eb504f3;
                      auVar27._16_4_ = 0x3eb504f3;
                      auVar27._20_4_ = 0x3eb504f3;
                      auVar27._24_4_ = 0x3eb504f3;
                      auVar27._28_4_ = 0x3eb504f3;
                      auVar83 = vfmadd231ps_avx512vl(auVar99,auVar83,auVar27);
                      auVar28._8_4_ = 0x403504f3;
                      auVar28._0_8_ = 0x403504f3403504f3;
                      auVar28._12_4_ = 0x403504f3;
                      auVar28._16_4_ = 0x403504f3;
                      auVar28._20_4_ = 0x403504f3;
                      auVar28._24_4_ = 0x403504f3;
                      auVar28._28_4_ = 0x403504f3;
                      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar130,auVar28);
                      auVar110 = auVar112._16_16_;
                      auVar132 = auVar81._16_16_;
                      auVar77 = auVar82._16_16_;
                      auVar97 = auVar83._16_16_;
                      auVar79 = auVar81._0_16_;
                      auVar78 = auVar82._0_16_;
                      auVar76 = auVar83._0_16_;
                      if (iVar72 == 1) {
                        *(float *)*pauVar62 = auVar109._0_4_;
                        uVar11 = vextractps_avx(auVar109,1);
                        *(undefined4 *)(*pauVar62 + lVar35 * 4) = uVar11;
                        uVar11 = vextractps_avx(auVar109,2);
                        *(undefined4 *)(*pauVar62 + lVar41 * 4) = uVar11;
                        uVar11 = vextractps_avx(auVar109,3);
                        *(undefined4 *)(*pauVar62 + lVar36 * 4) = uVar11;
                        *(float *)(*pauVar62 + lVar37 * 4) = auVar112._16_4_;
                        uVar11 = vextractps_avx(auVar110,1);
                        *(undefined4 *)(*pauVar62 + lVar38 * 4) = uVar11;
                        uVar11 = vextractps_avx(auVar110,2);
                        *(undefined4 *)(*pauVar62 + lVar39 * 4) = uVar11;
                        uVar11 = vextractps_avx(auVar110,3);
                        *(undefined4 *)(*pauVar62 + lVar40 * 4) = uVar11;
                        if (iVar54 < iVar10) {
                          *(int *)(*pauVar62 + 4) = auVar81._0_4_;
                          uVar11 = vextractps_avx(auVar79,1);
                          *(undefined4 *)(*pauVar62 + lVar35 * 4 + 4) = uVar11;
                          uVar11 = vextractps_avx(auVar79,2);
                          *(undefined4 *)(*pauVar62 + lVar41 * 4 + 4) = uVar11;
                          uVar11 = vextractps_avx(auVar79,3);
                          *(undefined4 *)(*pauVar62 + lVar36 * 4 + 4) = uVar11;
                          *(int *)(*pauVar62 + lVar37 * 4 + 4) = auVar81._16_4_;
                          uVar11 = vextractps_avx(auVar132,1);
                          *(undefined4 *)(*pauVar62 + lVar38 * 4 + 4) = uVar11;
                          uVar11 = vextractps_avx(auVar132,2);
                          *(undefined4 *)(*pauVar62 + lVar39 * 4 + 4) = uVar11;
                          uVar11 = vextractps_avx(auVar132,3);
                          *(undefined4 *)(*pauVar62 + lVar40 * 4 + 4) = uVar11;
                        }
                        if (iVar55 < iVar10) {
                          *(int *)(*pauVar62 + 8) = auVar82._0_4_;
                          uVar11 = vextractps_avx(auVar78,1);
                          *(undefined4 *)(*pauVar62 + lVar35 * 4 + 8) = uVar11;
                          uVar11 = vextractps_avx(auVar78,2);
                          *(undefined4 *)(*pauVar62 + lVar41 * 4 + 8) = uVar11;
                          uVar11 = vextractps_avx(auVar78,3);
                          *(undefined4 *)(*pauVar62 + lVar36 * 4 + 8) = uVar11;
                          *(int *)(*pauVar62 + lVar37 * 4 + 8) = auVar82._16_4_;
                          uVar11 = vextractps_avx(auVar77,1);
                          *(undefined4 *)(*pauVar62 + lVar38 * 4 + 8) = uVar11;
                          uVar11 = vextractps_avx(auVar77,2);
                          *(undefined4 *)(*pauVar62 + lVar39 * 4 + 8) = uVar11;
                          uVar11 = vextractps_avx(auVar77,3);
                          *(undefined4 *)(*pauVar62 + lVar40 * 4 + 8) = uVar11;
                        }
                        if (iVar63 < iVar10) {
                          *(int *)(*pauVar62 + 0xc) = auVar83._0_4_;
                          uVar11 = vextractps_avx(auVar76,1);
                          *(undefined4 *)(*pauVar62 + lVar35 * 4 + 0xc) = uVar11;
                          uVar11 = vextractps_avx(auVar76,2);
                          *(undefined4 *)(*pauVar62 + lVar41 * 4 + 0xc) = uVar11;
                          uVar11 = vextractps_avx(auVar76,3);
                          *(undefined4 *)(*pauVar62 + lVar36 * 4 + 0xc) = uVar11;
                          *(int *)(*pauVar62 + lVar37 * 4 + 0xc) = auVar83._16_4_;
                          uVar11 = vextractps_avx(auVar97,1);
                          *(undefined4 *)(*pauVar62 + lVar38 * 4 + 0xc) = uVar11;
                          uVar11 = vextractps_avx(auVar97,2);
                          *(undefined4 *)(*pauVar62 + lVar39 * 4 + 0xc) = uVar11;
                          uVar11 = vextractps_avx(auVar97,3);
                          *(undefined4 *)(*pauVar62 + lVar40 * 4 + 0xc) = uVar11;
                        }
                      }
                      else if (iVar72 == 4) {
                        *(undefined1 (*) [16])*pauVar62 = auVar109;
                        *(undefined1 (*) [16])(*pauVar62 + lVar35 * 4) = auVar110;
                        if (iVar54 < iVar10) {
                          *(undefined1 (*) [16])(*pauVar62 + 0x10) = auVar79;
                          *(undefined1 (*) [16])(*pauVar62 + lVar35 * 4 + 0x10) = auVar132;
                        }
                        if (iVar55 < iVar10) {
                          *(undefined1 (*) [16])pauVar62[1] = auVar78;
                          *(undefined1 (*) [16])(pauVar62[1] + lVar35 * 4) = auVar77;
                        }
                        if (iVar63 < iVar10) {
                          *(undefined1 (*) [16])(pauVar62[1] + 0x10) = auVar76;
                          *(undefined1 (*) [16])(pauVar62[1] + lVar35 * 4 + 0x10) = auVar97;
                        }
                      }
                      else if (iVar72 == 8) {
                        *pauVar62 = auVar112;
                        if (iVar54 < iVar10) {
                          pauVar62[1] = auVar81;
                        }
                        if (iVar55 < iVar10) {
                          pauVar62[2] = auVar82;
                        }
                        if (iVar63 < iVar10) {
                          pauVar62[3] = auVar83;
                        }
                      }
                      pauVar62 = (undefined1 (*) [32])(*pauVar62 + (long)(iVar72 * iVar10) * 4);
                    }
                    lVar42 = lVar42 + 1;
                    pfVar61 = pfVar61 + 0x30;
                  } while (lVar42 != 4);
                  uVar46 = uVar46 + 1;
                  pfVar60 = pfVar60 + 8;
                } while (uVar46 != max_jj);
              }
              uVar46 = uVar49 + 8;
              lVar42 = uVar49 + 0xf;
              iVar47 = iVar47 + uVar53 * 0x120;
              uVar49 = uVar46;
            } while (lVar42 < local_800);
          }
          lVar35 = (long)(int)(uVar53 * 4);
          if ((int)((uint)uVar46 | 3) < (int)max_ii) {
            lVar36 = (long)(int)uVar31;
            lVar37 = (long)(int)(uVar31 * 2);
            lVar38 = (long)(int)(uVar31 * 3);
            iVar47 = (uint)uVar46 * uVar53 * 0x24;
            uVar49 = uVar46 & 0xffffffff;
            do {
              if (pvVar12 == (void *)0x0) {
                auVar76 = ZEXT816(0) << 0x40;
              }
              else {
                auVar76 = *(undefined1 (*) [16])((long)pvVar12 + uVar49 * 4 + lVar33 * 4);
              }
              if (0 < (int)max_jj) {
                pfVar60 = (float *)((long)&top_blob_00->data + (long)iVar47 * 4);
                uVar46 = 0;
                do {
                  iVar63 = (int)uVar46 + iVar64;
                  lVar39 = -0x60;
                  auVar78._8_4_ = 0x3fb504f3;
                  auVar78._0_8_ = 0x3fb504f33fb504f3;
                  auVar78._12_4_ = 0x3fb504f3;
                  auVar77._8_4_ = 0x40000000;
                  auVar77._0_8_ = 0x4000000040000000;
                  auVar77._12_4_ = 0x40000000;
                  auVar79._8_4_ = 0x3eb504f3;
                  auVar79._0_8_ = 0x3eb504f33eb504f3;
                  auVar79._12_4_ = 0x3eb504f3;
                  auVar132._8_4_ = 0x403504f3;
                  auVar132._0_8_ = 0x403504f3403504f3;
                  auVar132._12_4_ = 0x403504f3;
                  pfVar61 = pfVar60;
                  do {
                    auVar97 = *(undefined1 (*) [16])(pfVar61 + lVar35);
                    auVar109 = *(undefined1 (*) [16])(pfVar61 + lVar34);
                    auVar110 = *(undefined1 (*) [16])(pfVar61 + (int)(uVar53 * 0xc));
                    auVar114 = *(undefined1 (*) [16])(pfVar61 + lVar71);
                    fVar113 = auVar109._0_4_ + auVar97._0_4_;
                    fVar116 = auVar109._4_4_ + auVar97._4_4_;
                    fVar117 = auVar109._8_4_ + auVar97._8_4_;
                    fVar118 = auVar109._12_4_ + auVar97._12_4_;
                    auVar123._0_4_ = auVar114._0_4_ + auVar110._0_4_;
                    auVar123._4_4_ = auVar114._4_4_ + auVar110._4_4_;
                    auVar123._8_4_ = auVar114._8_4_ + auVar110._8_4_;
                    auVar123._12_4_ = auVar114._12_4_ + auVar110._12_4_;
                    auVar97 = vsubps_avx(auVar97,auVar109);
                    auVar109 = vsubps_avx(auVar110,auVar114);
                    auVar103._0_4_ = fVar113 + *pfVar61 + auVar123._0_4_;
                    auVar103._4_4_ = fVar116 + pfVar61[1] + auVar123._4_4_;
                    auVar103._8_4_ = fVar117 + pfVar61[2] + auVar123._8_4_;
                    auVar103._12_4_ = fVar118 + pfVar61[3] + auVar123._12_4_;
                    auVar110._0_4_ = auVar97._0_4_ * 0.70710677;
                    auVar110._4_4_ = auVar97._4_4_ * 0.70710677;
                    auVar110._8_4_ = auVar97._8_4_ * 0.70710677;
                    auVar110._12_4_ = auVar97._12_4_ * 0.70710677;
                    auVar110 = vfmadd231ps_fma(auVar110,auVar109,auVar78);
                    auVar114._0_4_ = fVar113 * 0.5;
                    auVar114._4_4_ = fVar116 * 0.5;
                    auVar114._8_4_ = fVar117 * 0.5;
                    auVar114._12_4_ = fVar118 * 0.5;
                    auVar97 = vfmadd213ps_fma(auVar97,auVar79,
                                              *(undefined1 (*) [16])(pfVar61 + (int)(uVar53 * 0x14))
                                             );
                    auVar114 = vfmadd231ps_fma(auVar114,auVar123,auVar77);
                    auVar97 = vfmadd231ps_fma(auVar97,auVar109,auVar132);
                    *(undefined1 (*) [16])((long)auStack_620 + lVar39) = auVar103;
                    *(undefined1 (*) [16])((long)local_5c0 + lVar39) = auVar110;
                    *(undefined1 (*) [16])(auStack_560 + lVar39) = auVar114;
                    *(undefined1 (*) [16])(auStack_500 + lVar39) = auVar97;
                    pfVar61 = pfVar61 + (int)(uVar53 * 0x18);
                    lVar39 = lVar39 + 0x10;
                  } while (lVar39 != 0);
                  iVar65 = iVar63 % iVar68;
                  uVar66 = iVar63 / iVar68 << 2;
                  pauVar75 = (undefined1 (*) [16])
                             ((long)top_blob->data +
                             (long)(iVar65 * 4 * iVar72) * 4 +
                             (long)top_blob->w * top_blob->elemsize * (long)(int)uVar66 +
                             top_blob->cstep * (long)((iVar69 + (int)uVar49) / iVar72) *
                             top_blob->elemsize);
                  iVar54 = iVar65 * 4 + 1;
                  iVar55 = iVar65 * 4 + 2;
                  iVar63 = iVar65 * 4 + 3;
                  pfVar61 = afStack_638 + 2;
                  lVar39 = 0;
                  do {
                    if ((int)(uVar66 | (uint)lVar39) < iVar50) {
                      auVar97 = *(undefined1 (*) [16])(pfVar61 + -0x10);
                      auVar78 = *(undefined1 (*) [16])(pfVar61 + -0xc);
                      auVar77 = *(undefined1 (*) [16])(pfVar61 + -8);
                      auVar79 = *(undefined1 (*) [16])(pfVar61 + -4);
                      auVar100._0_4_ = auVar78._0_4_ + auVar97._0_4_;
                      auVar100._4_4_ = auVar78._4_4_ + auVar97._4_4_;
                      auVar100._8_4_ = auVar78._8_4_ + auVar97._8_4_;
                      auVar100._12_4_ = auVar78._12_4_ + auVar97._12_4_;
                      auVar124._0_4_ = auVar79._0_4_ + auVar77._0_4_;
                      auVar124._4_4_ = auVar79._4_4_ + auVar77._4_4_;
                      auVar124._8_4_ = auVar79._8_4_ + auVar77._8_4_;
                      auVar124._12_4_ = auVar79._12_4_ + auVar77._12_4_;
                      auVar97 = vsubps_avx(auVar97,auVar78);
                      auVar78 = vsubps_avx(auVar77,auVar79);
                      auVar111._0_4_ =
                           auVar76._0_4_ + pfVar61[-0x14] + auVar100._0_4_ + auVar124._0_4_;
                      auVar111._4_4_ =
                           auVar76._4_4_ + pfVar61[-0x13] + auVar100._4_4_ + auVar124._4_4_;
                      auVar111._8_4_ =
                           auVar76._8_4_ + pfVar61[-0x12] + auVar100._8_4_ + auVar124._8_4_;
                      auVar111._12_4_ =
                           auVar76._12_4_ + pfVar61[-0x11] + auVar100._12_4_ + auVar124._12_4_;
                      auVar19._8_4_ = 0x3f3504f3;
                      auVar19._0_8_ = 0x3f3504f33f3504f3;
                      auVar19._12_4_ = 0x3f3504f3;
                      auVar77 = vfmadd231ps_avx512vl(auVar76,auVar97,auVar19);
                      auVar20._8_4_ = 0x3f000000;
                      auVar20._0_8_ = 0x3f0000003f000000;
                      auVar20._12_4_ = 0x3f000000;
                      auVar79 = vfmadd132ps_avx512vl(auVar100,auVar76,auVar20);
                      auVar21._8_4_ = 0x40000000;
                      auVar21._0_8_ = 0x4000000040000000;
                      auVar21._12_4_ = 0x40000000;
                      auVar79 = vfmadd231ps_avx512vl(auVar79,auVar124,auVar21);
                      auVar98._0_4_ = auVar76._0_4_ + *pfVar61;
                      auVar98._4_4_ = auVar76._4_4_ + pfVar61[1];
                      auVar98._8_4_ = auVar76._8_4_ + pfVar61[2];
                      auVar98._12_4_ = auVar76._12_4_ + pfVar61[3];
                      auVar22._8_4_ = 0x3fb504f3;
                      auVar22._0_8_ = 0x3fb504f33fb504f3;
                      auVar22._12_4_ = 0x3fb504f3;
                      auVar77 = vfmadd231ps_avx512vl(auVar77,auVar78,auVar22);
                      auVar23._8_4_ = 0x3eb504f3;
                      auVar23._0_8_ = 0x3eb504f33eb504f3;
                      auVar23._12_4_ = 0x3eb504f3;
                      auVar97 = vfmadd231ps_avx512vl(auVar98,auVar97,auVar23);
                      auVar24._8_4_ = 0x403504f3;
                      auVar24._0_8_ = 0x403504f3403504f3;
                      auVar24._12_4_ = 0x403504f3;
                      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar78,auVar24);
                      if (iVar72 == 1) {
                        *(float *)*pauVar75 = auVar111._0_4_;
                        uVar11 = vextractps_avx(auVar111,1);
                        *(undefined4 *)(*pauVar75 + lVar36 * 4) = uVar11;
                        uVar11 = vextractps_avx(auVar111,2);
                        *(undefined4 *)(*pauVar75 + lVar37 * 4) = uVar11;
                        uVar11 = vextractps_avx(auVar111,3);
                        *(undefined4 *)(*pauVar75 + lVar38 * 4) = uVar11;
                        if (iVar54 < iVar10) {
                          *(int *)(*pauVar75 + 4) = auVar77._0_4_;
                          uVar11 = vextractps_avx(auVar77,1);
                          *(undefined4 *)(*pauVar75 + lVar36 * 4 + 4) = uVar11;
                          uVar11 = vextractps_avx(auVar77,2);
                          *(undefined4 *)(*pauVar75 + lVar37 * 4 + 4) = uVar11;
                          uVar11 = vextractps_avx(auVar77,3);
                          *(undefined4 *)(*pauVar75 + lVar38 * 4 + 4) = uVar11;
                        }
                        if (iVar55 < iVar10) {
                          *(int *)(*pauVar75 + 8) = auVar79._0_4_;
                          uVar11 = vextractps_avx(auVar79,1);
                          *(undefined4 *)(*pauVar75 + lVar36 * 4 + 8) = uVar11;
                          uVar11 = vextractps_avx(auVar79,2);
                          *(undefined4 *)(*pauVar75 + lVar37 * 4 + 8) = uVar11;
                          uVar11 = vextractps_avx(auVar79,3);
                          *(undefined4 *)(*pauVar75 + lVar38 * 4 + 8) = uVar11;
                        }
                        if (iVar63 < iVar10) {
                          *(int *)(*pauVar75 + 0xc) = auVar97._0_4_;
                          uVar11 = vextractps_avx(auVar97,1);
                          *(undefined4 *)(*pauVar75 + lVar36 * 4 + 0xc) = uVar11;
                          uVar11 = vextractps_avx(auVar97,2);
                          *(undefined4 *)(*pauVar75 + lVar37 * 4 + 0xc) = uVar11;
                          uVar11 = vextractps_avx(auVar97,3);
                          *(undefined4 *)(*pauVar75 + lVar38 * 4 + 0xc) = uVar11;
                        }
                      }
                      else if (iVar72 == 4) {
                        *pauVar75 = auVar111;
                        if (iVar54 < iVar10) {
                          pauVar75[1] = auVar77;
                        }
                        if (iVar55 < iVar10) {
                          pauVar75[2] = auVar79;
                        }
                        if (iVar63 < iVar10) {
                          pauVar75[3] = auVar97;
                        }
                      }
                      pauVar75 = (undefined1 (*) [16])(*pauVar75 + (long)(iVar72 * iVar10) * 4);
                    }
                    lVar39 = lVar39 + 1;
                    pfVar61 = pfVar61 + 0x18;
                  } while (lVar39 != 4);
                  uVar46 = uVar46 + 1;
                  pfVar60 = pfVar60 + 4;
                } while (uVar46 != max_jj);
              }
              uVar46 = uVar49 + 4;
              lVar39 = uVar49 + 7;
              iVar47 = iVar47 + uVar53 * 0x90;
              uVar49 = uVar46;
            } while (lVar39 < local_800);
          }
          uVar66 = (uint)uVar46;
          if ((int)(uVar66 | 1) < (int)max_ii) {
            iVar72 = top_blob->w;
            pvVar13 = top_blob->data;
            sVar14 = top_blob->elemsize;
            sVar15 = top_blob->cstep;
            iVar69 = uVar66 * uVar53 * 0x24;
            uVar49 = (long)(int)uVar66;
            do {
              if (pvVar12 == (void *)0x0) {
                auVar76 = ZEXT816(0) << 0x40;
                auVar97 = (undefined1  [16])0x0;
              }
              else {
                auVar76 = ZEXT416(*(uint *)((long)pvVar12 + (lVar33 + uVar49) * 4));
                auVar97 = ZEXT416(*(uint *)((long)pvVar12 + (lVar33 + uVar49) * 4 + 4));
              }
              if (0 < (int)max_jj) {
                puVar57 = (undefined8 *)((long)&top_blob_00->data + (long)iVar69 * 4);
                uVar46 = 0;
                do {
                  iVar47 = (int)uVar46 + iVar64;
                  lVar71 = -0x30;
                  auVar131._8_4_ = 0x40000000;
                  auVar131._0_8_ = 0x4000000040000000;
                  auVar131._12_4_ = 0x40000000;
                  puVar58 = puVar57;
                  do {
                    uVar2 = *(ulong *)((long)puVar58 + (long)(int)(uVar53 * 2) * 4);
                    auVar101._8_8_ = 0;
                    auVar101._0_8_ = uVar2;
                    uVar3 = *(ulong *)((long)puVar58 + lVar35 * 4);
                    auVar104._8_8_ = 0;
                    auVar104._0_8_ = uVar3;
                    fVar113 = (float)uVar3 + (float)uVar2;
                    fVar116 = (float)(uVar3 >> 0x20) + (float)(uVar2 >> 0x20);
                    uVar2 = *(ulong *)((long)puVar58 + (long)(int)(uVar53 * 6) * 4);
                    auVar115._8_8_ = 0;
                    auVar115._0_8_ = uVar2;
                    uVar3 = *(ulong *)((long)puVar58 + lVar34 * 4);
                    auVar125._8_8_ = 0;
                    auVar125._0_8_ = uVar3;
                    auVar128._0_4_ = (float)uVar3 + (float)uVar2;
                    auVar128._4_4_ = (float)(uVar3 >> 0x20) + (float)(uVar2 >> 0x20);
                    auVar128._8_8_ = 0;
                    auVar129._0_4_ = auVar128._0_4_ + fVar113 + (float)*puVar58;
                    auVar129._4_4_ = auVar128._4_4_ + fVar116 + (float)((ulong)*puVar58 >> 0x20);
                    auVar129._8_8_ = 0;
                    uVar4 = vmovlps_avx(auVar129);
                    *(undefined8 *)((long)afStack_638 + lVar71 + -0x18) = uVar4;
                    auVar78 = vinsertps_avx(auVar115,auVar101,0x50);
                    auVar77 = vinsertps_avx(auVar125,auVar104,0x50);
                    auVar79 = vsubps_avx(auVar78,auVar77);
                    auVar78 = vinsertps_avx(auVar101,auVar115,0x50);
                    auVar77 = vinsertps_avx(auVar104,auVar125,0x50);
                    auVar78 = vsubps_avx(auVar78,auVar77);
                    auVar105._0_4_ = auVar79._0_4_ * SUB164(ZEXT816(0x3f3504f33fb504f3),0);
                    auVar105._4_4_ = auVar79._4_4_ * SUB164(ZEXT816(0x3f3504f33fb504f3),4);
                    auVar105._8_4_ = auVar79._8_4_ * 0.0;
                    auVar105._12_4_ = auVar79._12_4_ * 0.0;
                    auVar77 = vfmadd231ps_fma(auVar105,auVar78,ZEXT816(0x3fb504f33f3504f3));
                    uVar4 = vmovlps_avx(auVar77);
                    *(undefined8 *)((long)auStack_620 + lVar71) = uVar4;
                    auVar106._0_4_ = fVar113 * 0.5;
                    auVar106._4_4_ = fVar116 * 0.5;
                    auVar106._8_8_ = 0;
                    auVar77 = vfmadd231ps_fma(auVar106,auVar128,auVar131);
                    uVar4 = vmovlps_avx(auVar77);
                    *(undefined8 *)((long)auStack_5f0 + lVar71) = uVar4;
                    auVar107._8_8_ = 0;
                    auVar107._0_8_ = *(ulong *)((long)puVar58 + (long)(int)(uVar53 * 10) * 4);
                    auVar77 = vfmadd231ps_fma(auVar107,auVar79,ZEXT816(0x3eb504f3403504f3));
                    auVar78 = vfmadd231ps_fma(auVar77,auVar78,ZEXT816(0x403504f33eb504f3));
                    uVar4 = vmovlps_avx(auVar78);
                    *(undefined8 *)((long)local_5c0 + lVar71) = uVar4;
                    puVar58 = (undefined8 *)((long)puVar58 + (long)(int)(uVar53 * 0xc) * 4);
                    lVar71 = lVar71 + 8;
                  } while (lVar71 != 0);
                  iVar63 = iVar47 % iVar68;
                  uVar66 = iVar47 / iVar68 << 2;
                  pfVar60 = (float *)((long)pvVar13 +
                                     (long)(iVar63 * 4) * 4 +
                                     (long)(int)uVar66 * (long)iVar72 * sVar14 +
                                     (lVar33 + uVar49) * sVar15 * sVar14);
                  piVar59 = &local_680.w;
                  lVar71 = 0;
                  do {
                    if ((int)(uVar66 | (uint)lVar71) < iVar50) {
                      fVar113 = (float)piVar59[-5];
                      fVar116 = (float)piVar59[-4];
                      fVar117 = (float)piVar59[-3];
                      fVar118 = (float)piVar59[-2];
                      fVar122 = (float)piVar59[-7] + (float)piVar59[-9];
                      fVar16 = (float)piVar59[-6] + (float)piVar59[-8];
                      fVar17 = fVar117 + fVar113;
                      fVar18 = fVar118 + fVar116;
                      fVar119 = (float)piVar59[-10];
                      auVar110 = ZEXT416((uint)((float)piVar59[-9] - (float)piVar59[-7]));
                      auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3eb504f3),0),auVar110,auVar76);
                      fVar120 = (float)piVar59[-1];
                      auVar109 = ZEXT416((uint)((float)piVar59[-8] - (float)piVar59[-6]));
                      auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3eb504f3),0),auVar109,auVar97);
                      fVar121 = (float)*piVar59;
                      *pfVar60 = auVar76._0_4_ + *(float *)&((Mat *)(piVar59 + -0xb))->data +
                                 fVar122 + fVar17;
                      pfVar60[(int)uVar31] = auVar97._0_4_ + fVar119 + fVar16 + fVar18;
                      auVar132 = ZEXT416((uint)(fVar116 - fVar118));
                      auVar79 = ZEXT416((uint)(fVar113 - fVar117));
                      if (iVar63 * 4 + 1 < iVar10) {
                        auVar109 = vfmadd213ss_fma(auVar109,SUB6416(ZEXT464(0x3f3504f3),0),auVar97);
                        auVar114 = vfmadd231ss_fma(auVar109,auVar132,SUB6416(ZEXT464(0x3fb504f3),0))
                        ;
                        auVar109 = vfmadd213ss_fma(auVar110,SUB6416(ZEXT464(0x3f3504f3),0),auVar76);
                        auVar109 = vfmadd231ss_fma(auVar109,auVar79,SUB6416(ZEXT464(0x3fb504f3),0));
                        pfVar60[1] = auVar109._0_4_;
                        pfVar60[(long)(int)uVar31 + 1] = auVar114._0_4_;
                      }
                      if (iVar63 * 4 + 2 < iVar10) {
                        auVar109 = vfmadd213ss_fma(ZEXT416((uint)fVar122),
                                                   SUB6416(ZEXT464(0x3f000000),0),auVar76);
                        auVar109 = vfmadd213ss_fma(ZEXT416((uint)fVar17),
                                                   SUB6416(ZEXT464(0x40000000),0),auVar109);
                        auVar110 = vfmadd213ss_fma(ZEXT416((uint)fVar16),
                                                   SUB6416(ZEXT464(0x3f000000),0),auVar97);
                        auVar110 = vfmadd213ss_fma(ZEXT416((uint)fVar18),
                                                   SUB6416(ZEXT464(0x40000000),0),auVar110);
                        pfVar60[2] = auVar109._0_4_;
                        pfVar60[(long)(int)uVar31 + 2] = auVar110._0_4_;
                      }
                      if (iVar63 * 4 + 3 < iVar10) {
                        auVar78 = vfmadd213ss_fma(auVar79,SUB6416(ZEXT464(0x403504f3),0),
                                                  ZEXT416((uint)(auVar78._0_4_ + fVar120)));
                        auVar77 = vfmadd213ss_fma(auVar132,SUB6416(ZEXT464(0x403504f3),0),
                                                  ZEXT416((uint)(auVar77._0_4_ + fVar121)));
                        pfVar60[3] = auVar78._0_4_;
                        pfVar60[(long)(int)uVar31 + 3] = auVar77._0_4_;
                      }
                      pfVar60 = pfVar60 + iVar10;
                    }
                    lVar71 = lVar71 + 1;
                    piVar59 = piVar59 + 0xc;
                  } while (lVar71 != 4);
                  uVar46 = uVar46 + 1;
                  puVar57 = puVar57 + 1;
                } while (uVar46 != max_jj);
              }
              uVar46 = uVar49 + 2;
              lVar71 = uVar49 + 3;
              iVar69 = iVar69 + uVar53 * 0x48;
              uVar49 = uVar46;
            } while (lVar71 < local_800);
          }
          iVar72 = (int)uVar46;
          if (iVar72 < (int)max_ii) {
            iVar69 = top_blob->w;
            pvVar13 = top_blob->data;
            sVar14 = top_blob->elemsize;
            sVar15 = top_blob->cstep;
            lVar71 = (long)iVar72;
            iVar72 = iVar72 * uVar53 * 0x24;
            do {
              if (pvVar12 == (void *)0x0) {
                auVar76 = ZEXT816(0) << 0x40;
              }
              else {
                auVar76 = ZEXT416(*(uint *)((long)pvVar12 + lVar71 * 4 + lVar33 * 4));
              }
              if (0 < (int)max_jj) {
                pfVar60 = (float *)((long)&top_blob_00->data + (long)iVar72 * 4);
                uVar46 = 0;
                do {
                  iVar47 = (int)uVar46 + iVar64;
                  lVar34 = -0x18;
                  pfVar61 = pfVar60;
                  do {
                    fVar117 = pfVar61[(int)(uVar53 * 2)] + pfVar61[local_698];
                    fVar113 = pfVar61[(int)(uVar53 * 3)];
                    fVar116 = pfVar61[lVar35];
                    fVar118 = fVar116 + fVar113;
                    fVar119 = pfVar61[local_698] - pfVar61[(int)(uVar53 * 2)];
                    *(float *)((long)afStack_638 + lVar34 + -0x30) = fVar117 + *pfVar61 + fVar118;
                    auVar78 = ZEXT416((uint)(fVar113 - fVar116));
                    auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar119 * 0.70710677)),auVar78,
                                              SUB6416(ZEXT464(0x3fb504f3),0));
                    *(int *)((long)afStack_638 + lVar34 + -0x18) = auVar97._0_4_;
                    auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar117 * 0.5)),ZEXT416((uint)fVar118),
                                              SUB6416(ZEXT464(0x40000000),0));
                    *(int *)((long)afStack_638 + lVar34) = auVar97._0_4_;
                    auVar97 = vfmadd213ss_fma(ZEXT416((uint)fVar119),SUB6416(ZEXT464(0x3eb504f3),0),
                                              ZEXT416((uint)pfVar61[(int)(uVar53 * 5)]));
                    auVar97 = vfmadd231ss_fma(auVar97,auVar78,SUB6416(ZEXT464(0x403504f3),0));
                    *(int *)((long)auStack_620 + lVar34) = auVar97._0_4_;
                    pfVar61 = pfVar61 + (int)(uVar53 * 6);
                    lVar34 = lVar34 + 4;
                  } while (lVar34 != 0);
                  iVar63 = iVar47 % iVar68;
                  uVar31 = iVar47 / iVar68 << 2;
                  pfVar61 = (float *)((long)pvVar13 +
                                     (long)(iVar63 * 4) * 4 +
                                     (long)(int)uVar31 * (long)iVar69 * sVar14 +
                                     (lVar33 + lVar71) * sVar15 * sVar14);
                  pfVar67 = (float *)((long)&local_680.elemsize + 4);
                  lVar34 = 0;
                  do {
                    if ((int)(uVar31 | (uint)lVar34) < iVar50) {
                      fVar113 = pfVar67[-3] + pfVar67[-4];
                      fVar116 = pfVar67[-1] + pfVar67[-2];
                      auVar97 = vfmadd132ss_fma(ZEXT416((uint)fVar113),auVar76,ZEXT416(0x3f000000));
                      auVar77 = ZEXT416((uint)(pfVar67[-4] - pfVar67[-3]));
                      auVar78 = vfmadd231ss_fma(auVar76,auVar77,ZEXT416(0x3eb504f3));
                      auVar97 = vfmadd231ss_fma(auVar97,ZEXT416((uint)fVar116),ZEXT416(0x40000000));
                      auVar79 = ZEXT416((uint)(pfVar67[-2] - pfVar67[-1]));
                      auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ + *pfVar67)),auVar79,
                                                ZEXT416(0x403504f3));
                      *pfVar61 = auVar76._0_4_ + pfVar67[-5] + fVar113 + fVar116;
                      if (iVar63 * 4 + 1 < iVar10) {
                        auVar77 = vfmadd132ss_fma(auVar77,auVar76,ZEXT416(0x3f3504f3));
                        auVar77 = vfmadd231ss_fma(auVar77,auVar79,ZEXT416(0x3fb504f3));
                        pfVar61[1] = auVar77._0_4_;
                      }
                      if (iVar63 * 4 + 2 < iVar10) {
                        pfVar61[2] = auVar97._0_4_;
                      }
                      if (iVar63 * 4 + 3 < iVar10) {
                        pfVar61[3] = auVar78._0_4_;
                      }
                      pfVar61 = pfVar61 + iVar10;
                    }
                    lVar34 = lVar34 + 1;
                    pfVar67 = pfVar67 + 6;
                  } while (lVar34 != 4);
                  uVar46 = uVar46 + 1;
                  pfVar60 = pfVar60 + 1;
                } while (uVar46 != max_jj);
              }
              lVar71 = lVar71 + 1;
              iVar72 = iVar72 + uVar53 * 0x24;
            } while (lVar71 != local_800);
          }
          iVar64 = iVar64 + (int)local_738;
          lVar71 = local_738;
          uVar53 = local_7e0 - (int)local_738;
        } while (iVar64 < (int)N);
      }
      uVar70 = uVar70 + 1;
    } while (uVar70 != uVar30);
  }
  piVar59 = (int *)CONCAT44(local_7d0.refcount._4_4_,local_7d0.refcount._0_4_);
  if (piVar59 != (int *)0x0) {
    LOCK();
    *piVar59 = *piVar59 + -1;
    UNLOCK();
    if (*piVar59 == 0) {
      if (local_7d0.allocator == (Allocator *)0x0) {
        if (local_7d0.data != (void *)0x0) {
          free(local_7d0.data);
        }
      }
      else {
        (*(local_7d0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar59 = (int *)CONCAT44(local_780.refcount._4_4_,local_780.refcount._0_4_);
  if (piVar59 != (int *)0x0) {
    LOCK();
    *piVar59 = *piVar59 + -1;
    UNLOCK();
    if (*piVar59 == 0) {
      if (local_780.allocator == (Allocator *)0x0) {
        if (local_780.data != (void *)0x0) {
          free(local_780.data);
        }
      }
      else {
        (*(local_780.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int nT, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 4n+2, winograd F(4,3)
    int w_tiles = (outw + 3) / 4;
    int h_tiles = (outh + 3) / 4;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 36;

    // NCNN_LOGE("conv3x3s1_winograd43 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd43_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd43_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                gemm_transB_packed_tile(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk);
            }

            // transform output
            conv3x3s1_winograd43_transform_output_tile(top_tile, top_blob, bias, i, max_ii, j, max_jj);
        }
    }
}